

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock_test.cpp
# Opt level: O0

void __thiscall
SpinMutexTest_TryLockFail_Test<yamc::posix::spinlock>::TestBody
          (SpinMutexTest_TryLockFail_Test<yamc::posix::spinlock> *this)

{
  spinlock *this_00;
  bool bVar1;
  char *message;
  char *in_R9;
  string local_f8;
  AssertHelper local_d8;
  Message local_d0;
  bool local_c1;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_;
  type local_a0;
  join_thread local_90;
  join_thread thd;
  undefined1 local_80 [4];
  TypeParam mtx;
  barrier step;
  SpinMutexTest_TryLockFail_Test<yamc::posix::spinlock> *this_local;
  
  yamc::test::barrier::barrier((barrier *)local_80,2);
  this_00 = (spinlock *)((long)&thd.thd_._M_id._M_thread + 4);
  yamc::posix::spinlock::spinlock(this_00);
  local_a0.mtx = (TypeParam *)this_00;
  local_a0.step = (barrier *)local_80;
  yamc::test::join_thread::
  join_thread<SpinMutexTest_TryLockFail_Test<yamc::posix::spinlock>::TestBody()::_lambda()_1_>
            (&local_90,&local_a0);
  yamc::test::barrier::await((barrier *)local_80);
  local_c1 = yamc::posix::spinlock::try_lock((spinlock *)((long)&thd.thd_._M_id._M_thread + 4));
  local_c1 = !local_c1;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c0,&local_c1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f8,(internal *)local_c0,(AssertionResult *)"mtx.try_lock()","true","false",
               in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/spinlock_test.cpp"
               ,0x57,message);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  yamc::test::barrier::await((barrier *)local_80);
  yamc::test::join_thread::~join_thread(&local_90);
  yamc::posix::spinlock::~spinlock((spinlock *)((long)&thd.thd_._M_id._M_thread + 4));
  yamc::test::barrier::~barrier((barrier *)local_80);
  return;
}

Assistant:

TYPED_TEST(SpinMutexTest, TryLockFail)
{
  yamc::test::barrier step(2);
  TypeParam mtx;
  yamc::test::join_thread thd([&]{
    EXPECT_NO_THROW(mtx.lock());
    step.await();  // b1
    step.await();  // b2
    EXPECT_NO_THROW(mtx.unlock());
  });
  {
    step.await();  // b1
    EXPECT_FALSE(mtx.try_lock());
    step.await();  // b2
  }
}